

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTupleMake(TranslateToFuzzReader *this,Type type)

{
  char cVar1;
  Type *pTVar2;
  uintptr_t *puVar3;
  TupleMake *pTVar4;
  Expression *local_58;
  Expression *local_50;
  Type type_local;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elements;
  Iterator __begin1;
  
  local_50 = (Expression *)type.id;
  if (((this->wasm->features).features & 0x200) == 0) {
    __assert_fail("wasm.features.hasMultivalue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x611,"Expression *wasm::TranslateToFuzzReader::makeTupleMake(Type)");
  }
  cVar1 = ::wasm::Type::isTuple();
  if (cVar1 == '\0') {
    __assert_fail("type.isTuple()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x612,"Expression *wasm::TranslateToFuzzReader::makeTupleMake(Type)");
  }
  type_local.id = 0;
  elements.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  elements.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  elements.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &local_50;
  pTVar2 = (Type *)::wasm::Type::size();
  if (pTVar2 == (Type *)0x0) goto LAB_0013fb55;
  do {
    do {
      puVar3 = (uintptr_t *)
               ::wasm::Type::Iterator::operator*
                         ((Iterator *)
                          &elements.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_58 = make(this,(Type)*puVar3);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&type_local,
                 &local_58);
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
             pTVar2);
LAB_0013fb55:
  } while (elements.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage != &local_50);
  pTVar4 = Builder::makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                     (&this->builder,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&type_local
                     );
  if (type_local.id != 0) {
    operator_delete((void *)type_local.id,
                    (long)elements.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - type_local.id);
  }
  return (Expression *)pTVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeTupleMake(Type type) {
  assert(wasm.features.hasMultivalue());
  assert(type.isTuple());
  std::vector<Expression*> elements;
  for (const auto& t : type) {
    elements.push_back(make(t));
  }
  return builder.makeTupleMake(std::move(elements));
}